

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_time.c
# Opt level: O1

void read_stop_time(stop_time_t *record,int field_count,char **field_names,char **field_values)

{
  double dVar1;
  int iVar2;
  timepoint_precision_t tVar3;
  stop_type_t sVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  stop_time_t *__dest;
  
  record->trip_id[0] = '\0';
  record->arrival_time[0] = '\0';
  record->departure_time[0] = '\0';
  record->stop_id[0] = '\0';
  record->stop_sequence = 0;
  record->stop_headsign[0] = '\0';
  record->pickup_type = ST_REGULAR;
  record->dropoff_type = ST_REGULAR;
  record->shape_dist_traveled = 0.0;
  record->timepoint = TP_EXACT;
  if (0 < field_count) {
    uVar6 = 0;
    do {
      pcVar7 = field_names[uVar6];
      iVar2 = strcmp(pcVar7,"trip_id");
      if (iVar2 == 0) {
        pcVar7 = field_values[uVar6];
        __dest = record;
LAB_0010611e:
        strcpy(__dest->trip_id,pcVar7);
      }
      else {
        iVar2 = strcmp(pcVar7,"arrival_time");
        if (iVar2 == 0) {
          pcVar7 = field_values[uVar6];
          __dest = (stop_time_t *)record->arrival_time;
          goto LAB_0010611e;
        }
        iVar2 = strcmp(pcVar7,"departure_time");
        if (iVar2 == 0) {
          pcVar7 = field_values[uVar6];
          __dest = (stop_time_t *)record->departure_time;
          goto LAB_0010611e;
        }
        iVar2 = strcmp(pcVar7,"stop_id");
        if (iVar2 == 0) {
          pcVar7 = field_values[uVar6];
          __dest = (stop_time_t *)record->stop_id;
          goto LAB_0010611e;
        }
        iVar2 = strcmp(pcVar7,"stop_sequence");
        if (iVar2 == 0) {
          uVar5 = strtoul(field_values[uVar6],(char **)0x0,0);
          record->stop_sequence = (uint)uVar5;
        }
        else {
          iVar2 = strcmp(pcVar7,"stop_headsign");
          if (iVar2 == 0) {
            pcVar7 = field_values[uVar6];
            __dest = (stop_time_t *)record->stop_headsign;
            goto LAB_0010611e;
          }
          iVar2 = strcmp(pcVar7,"pickup_type");
          if (iVar2 == 0) {
            sVar4 = parse_stop_type(field_values[uVar6]);
            record->pickup_type = sVar4;
          }
          else {
            iVar2 = strcmp(pcVar7,"drop_off_type");
            if (iVar2 == 0) {
              sVar4 = parse_stop_type(field_values[uVar6]);
              record->dropoff_type = sVar4;
            }
            else {
              iVar2 = strcmp(pcVar7,"shape_dist_traveled");
              if (iVar2 == 0) {
                dVar1 = strtod(field_values[uVar6],(char **)0x0);
                record->shape_dist_traveled = dVar1;
              }
              else {
                iVar2 = strcmp(pcVar7,"timepoint");
                if (iVar2 == 0) {
                  tVar3 = parse_timepoint_precision(field_values[uVar6]);
                  record->timepoint = tVar3;
                }
              }
            }
          }
        }
      }
      uVar6 = uVar6 + 1;
    } while ((uint)field_count != uVar6);
  }
  return;
}

Assistant:

void read_stop_time(stop_time_t *record, int field_count, const char **field_names, const char **field_values) {
    init_stop_time(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "trip_id") == 0) {
            strcpy(record->trip_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "arrival_time") == 0) {
            strcpy(record->arrival_time, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "departure_time") == 0) {
            strcpy(record->departure_time, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_id") == 0) {
            strcpy(record->stop_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_sequence") == 0) {
            record->stop_sequence = (unsigned int)strtoul(field_values[i], NULL, 0);
            continue;
        }
        if (strcmp(field_names[i], "stop_headsign") == 0) {
            strcpy(record->stop_headsign, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "pickup_type") == 0) {
            record->pickup_type = parse_stop_type(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "drop_off_type") == 0) {
            record->dropoff_type = parse_stop_type(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "shape_dist_traveled") == 0) {
            record->shape_dist_traveled = strtod(field_values[i], NULL);
            continue;
        }
        if (strcmp(field_names[i], "timepoint") == 0) {
            record->timepoint = parse_timepoint_precision(field_values[i]);
            continue;
        }
    }
}